

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Define.h
# Opt level: O2

Unique<anurbs::Entry<anurbs::Brep>_> __thiscall
anurbs::
new_<anurbs::Entry<anurbs::Brep>,std::__cxx11::string&,std::shared_ptr<anurbs::Brep>&,std::shared_ptr<anurbs::Attributes>&>
          (anurbs *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          shared_ptr<anurbs::Brep> *args_1,shared_ptr<anurbs::Attributes> *args_2)

{
  Entry<anurbs::Brep> *this_00;
  __shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<anurbs::Brep,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = (Entry<anurbs::Brep> *)operator_new(0x48);
  std::__shared_ptr<anurbs::Brep,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&args_1->super___shared_ptr<anurbs::Brep,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&args_2->super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>);
  Entry<anurbs::Brep>::Entry
            (this_00,args,(shared_ptr<anurbs::Brep> *)&local_40,
             (shared_ptr<anurbs::Attributes> *)&local_50);
  *(Entry<anurbs::Brep> **)this = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return (__uniq_ptr_data<anurbs::Entry<anurbs::Brep>,_std::default_delete<anurbs::Entry<anurbs::Brep>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Entry<anurbs::Brep>,_std::default_delete<anurbs::Entry<anurbs::Brep>_>,_true,_true>
            )this;
}

Assistant:

Unique<T> new_(TArgs&&... args)
{
    return Unique<T>(new T(std::forward<TArgs>(args)...));
}